

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetGXPortStatus(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char *local_28;
  char *dp;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x43 < port)) {
      if ((port < 0x44) || (0x46 < port)) {
        if ((port < 0x47) || (0x49 < port)) {
          return 0;
        }
        local_28 = pol->GxPassiveStatus + ((port + -0x47) * -2 + 0x16);
      }
      else {
        local_28 = pol->GxPassiveStatus + ((port + -0x44) * -2 + 0xe);
      }
    }
    else {
      local_28 = pol->GxPassiveStatus + ((port + -0x41) * -2 + 6);
    }
  }
  else {
    local_28 = pol->GxStatus + ((port + -0x31) * -2 + 6);
  }
  uVar1 = ndiHexToUnsignedLong(local_28,2);
  return (int)uVar1;
}

Assistant:

ndicapiExport int ndiGetGXPortStatus(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = &pol->GxStatus[6 - 2 * (port - '1')];
  }
  else if (port >= 'A' && port <= 'C')
  {
    dp = &pol->GxPassiveStatus[6 - 2 * (port - 'A')];
  }
  else if (port >= 'D' && port <= 'F')
  {
    dp = &pol->GxPassiveStatus[14 - 2 * (port - 'D')];
  }
  else if (port >= 'G' && port <= 'I')
  {
    dp = &pol->GxPassiveStatus[22 - 2 * (port - 'G')];
  }
  else
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}